

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.h
# Opt level: O2

string * __thiscall
flatbuffers::Namer::Variable(string *__return_storage_ptr__,Namer *this,string *p,string *s)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,p,"_");
  std::operator+(&local_60,&local_40,s);
  (*this->_vptr_Namer[0x14])(__return_storage_ptr__,this,&local_60,(ulong)(this->config_).variables)
  ;
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Variable(const std::string &p,
                               const std::string &s) const {
    return Format(p + "_" + s, config_.variables);
  }